

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteAmpEnableAxis(AmpIO *this,uint index,bool state)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  byte local_3a;
  byte local_39;
  uint local_2c;
  uint channel;
  quadlet_t write_data_1;
  quadlet_t write_data;
  quadlet_t mask;
  bool state_local;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar2 < 8) {
      uVar3 = 1 << ((byte)index & 0x1f);
      channel = uVar3 << 8;
      if (state) {
        channel = uVar3 | channel;
      }
      if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
        local_39 = 0;
      }
      else {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0,(ulong)channel
                          );
        local_39 = (byte)iVar4;
      }
      this_local._7_1_ = (bool)(local_39 & 1);
    }
    else {
      local_2c = 0x20000000;
      if (state) {
        local_2c = 0x30000000;
      }
      if ((this->super_FpgaIO).super_BoardIO.port == (BasePort *)0x0) {
        local_3a = 0;
      }
      else {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        iVar4 = (*pBVar1->_vptr_BasePort[0x24])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)((index + 1) * 0x10 | 1),(ulong)local_2c);
        local_3a = (byte)iVar4;
      }
      this_local._7_1_ = (bool)(local_3a & 1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::WriteAmpEnableAxis(unsigned int index, bool state)
{
    if (index >= NumMotors)
        return false;

    if (GetFirmwareVersion() < 8) {
        quadlet_t mask = (1 << index);
        quadlet_t write_data = (mask << 8);
        if (state) write_data |= mask;
        return (port ? port->WriteQuadlet(BoardId, BoardIO::BOARD_STATUS, write_data) : false);
    }
    else {
        quadlet_t write_data = MOTOR_ENABLE_MASK;
        if (state)
            write_data |=  MOTOR_ENABLE_BIT;
        unsigned int channel = (index+1) << 4;
        return (port ? port->WriteQuadlet(BoardId, channel | DAC_CTRL_REG, write_data) : false);
    }
}